

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O0

int Parser_xmlNamespace(Parser *xmlParser,IXML_Node *newNode)

{
  IXML_ElementStack *pIVar1;
  int iVar2;
  char *pcVar3;
  IXML_NamespaceURI *pNsURI;
  int local_40;
  uint local_3c;
  int line;
  int ret;
  IXML_NamespaceURI *pPrevNs;
  IXML_NamespaceURI *pNs;
  IXML_NamespaceURI *pNewNs;
  IXML_ElementStack *pCur;
  IXML_Node *newNode_local;
  Parser *xmlParser_local;
  
  pIVar1 = xmlParser->pCurElement;
  local_3c = 0;
  local_40 = 0;
  if (newNode->nodeName == (char *)0x0) {
    __assert_fail("newNode->nodeName != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                  ,0x6f0,"int Parser_xmlNamespace(Parser *, IXML_Node *)");
  }
  iVar2 = strcmp(newNode->nodeName,"xmlns");
  if (iVar2 == 0) {
    if (pIVar1->namespaceUri != (char *)0x0) {
      free(pIVar1->namespaceUri);
    }
    pcVar3 = safe_strdup(newNode->nodeValue);
    pIVar1->namespaceUri = pcVar3;
    if (pIVar1->namespaceUri == (char *)0x0) {
      local_3c = 0x66;
      local_40 = 0x6fa;
      goto LAB_0013e45d;
    }
  }
  else {
    iVar2 = strncmp(newNode->nodeName,"xmlns:",6);
    if (iVar2 == 0) {
      local_3c = Parser_setNodePrefixAndLocalName(newNode);
      if (local_3c != 0) {
        local_40 = 0x702;
        goto LAB_0013e45d;
      }
      if (newNode->localName == (char *)0x0) {
        __assert_fail("newNode->localName != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                      ,0x706,"int Parser_xmlNamespace(Parser *, IXML_Node *)");
      }
      if (pIVar1 == (IXML_ElementStack *)0x0) {
        local_3c = 0x6a;
        local_40 = 0x70a;
        goto LAB_0013e45d;
      }
      if ((pIVar1->prefix == (char *)0x0) ||
         (iVar2 = strcmp(pIVar1->prefix,newNode->localName), iVar2 != 0)) {
        _line = pIVar1->pNsURI;
        pPrevNs = _line;
        while ((pPrevNs != (IXML_NamespaceURI *)0x0 &&
               ((pPrevNs->prefix == (char *)0x0 ||
                (iVar2 = strcmp(pPrevNs->prefix,newNode->localName), iVar2 != 0))))) {
          _line = pPrevNs;
          pPrevNs = pPrevNs->nextNsURI;
        }
        if (pPrevNs == (IXML_NamespaceURI *)0x0) {
          pNsURI = (IXML_NamespaceURI *)malloc(0x18);
          if (pNsURI == (IXML_NamespaceURI *)0x0) {
            local_3c = 0x66;
            local_40 = 0x72c;
            goto LAB_0013e45d;
          }
          memset(pNsURI,0,0x18);
          pcVar3 = safe_strdup(newNode->localName);
          pNsURI->prefix = pcVar3;
          if (pNsURI->prefix == (char *)0x0) {
            free(pNsURI);
            local_3c = 0x66;
            local_40 = 0x735;
            goto LAB_0013e45d;
          }
          pcVar3 = safe_strdup(newNode->nodeValue);
          pNsURI->nsURI = pcVar3;
          if (pNsURI->nsURI == (char *)0x0) {
            Parser_freeNsURI(pNsURI);
            free(pNsURI);
            local_3c = 0x66;
            local_40 = 0x73d;
            goto LAB_0013e45d;
          }
          if (pIVar1->pNsURI == (IXML_NamespaceURI *)0x0) {
            pIVar1->pNsURI = pNsURI;
          }
          else {
            _line->nextNsURI = pNsURI;
          }
        }
        else {
          if (pPrevNs->nsURI != (char *)0x0) {
            free(pPrevNs->nsURI);
          }
          pcVar3 = safe_strdup(newNode->nodeValue);
          pPrevNs->nsURI = pcVar3;
          if (pPrevNs->nsURI == (char *)0x0) {
            local_3c = 0x66;
            local_40 = 0x74d;
            goto LAB_0013e45d;
          }
        }
      }
      else {
        if (pIVar1->namespaceUri != (char *)0x0) {
          free(pIVar1->namespaceUri);
        }
        pcVar3 = safe_strdup(newNode->nodeValue);
        pIVar1->namespaceUri = pcVar3;
        if (pIVar1->namespaceUri == (char *)0x0) {
          local_3c = 0x66;
          local_40 = 0x715;
          goto LAB_0013e45d;
        }
      }
    }
  }
  if (xmlParser->pNeedPrefixNode != (IXML_Node *)0x0) {
    local_3c = Parser_addNamespace(xmlParser);
    local_40 = 0x755;
  }
LAB_0013e45d:
  if ((local_3c != 0) && (local_3c != 0x68)) {
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,local_40,"Parser_xmlNamespace","Error %d\n",(ulong)local_3c);
  }
  return local_3c;
}

Assistant:

static int Parser_xmlNamespace(
	/*! [in] The XML parser. */
	Parser *xmlParser,
	/*! [in] The Node to process. */
	IXML_Node *newNode)
{
	IXML_ElementStack *pCur = xmlParser->pCurElement;
	IXML_NamespaceURI *pNewNs = NULL;
	IXML_NamespaceURI *pNs = NULL;
	IXML_NamespaceURI *pPrevNs = NULL;
	int ret = IXML_SUCCESS;
	int line = 0;

	/* if the newNode contains a namespace definition */
	assert(newNode->nodeName != NULL);

	if (strcmp(newNode->nodeName, "xmlns") == 0) {
		/* default namespace def. */
		if (pCur->namespaceUri != NULL) {
			free(pCur->namespaceUri);
		}
		pCur->namespaceUri = safe_strdup(newNode->nodeValue);
		if (pCur->namespaceUri == NULL) {
			ret = IXML_INSUFFICIENT_MEMORY;
			line = __LINE__;
			goto ExitFunction;
		}
	} else if (strncmp(newNode->nodeName, "xmlns:", strlen("xmlns:")) ==
		   0) {
		/* namespace definition */
		ret = Parser_setNodePrefixAndLocalName(newNode);
		if (ret != IXML_SUCCESS) {
			line = __LINE__;
			goto ExitFunction;
		}

		assert(newNode->localName != NULL);

		if (pCur == NULL) {
			ret = IXML_FAILED;
			line = __LINE__;
			goto ExitFunction;
		}
		if (pCur->prefix != NULL &&
			strcmp(pCur->prefix, newNode->localName) == 0) {
			if (pCur->namespaceUri != NULL) {
				free(pCur->namespaceUri);
			}
			pCur->namespaceUri = safe_strdup(newNode->nodeValue);
			if (pCur->namespaceUri == NULL) {
				ret = IXML_INSUFFICIENT_MEMORY;
				line = __LINE__;
				goto ExitFunction;
			}
		} else {
			pPrevNs = pCur->pNsURI;
			pNs = pPrevNs;
			while (pNs != NULL) {
				if (pNs->prefix != NULL &&
					strcmp(pNs->prefix,
						newNode->localName) == 0) {
					/* replace namespace definition */
					break;
				} else {
					pPrevNs = pNs;
					pNs = pNs->nextNsURI;
				}
			}
			if (pNs == NULL) {
				/* a new definition */
				pNewNs = (IXML_NamespaceURI *)malloc(
					sizeof(IXML_NamespaceURI));
				if (pNewNs == NULL) {
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				memset(pNewNs, 0, sizeof(IXML_NamespaceURI));
				pNewNs->prefix =
					safe_strdup(newNode->localName);
				if (pNewNs->prefix == NULL) {
					free(pNewNs);
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				pNewNs->nsURI = safe_strdup(newNode->nodeValue);
				if (pNewNs->nsURI == NULL) {
					Parser_freeNsURI(pNewNs);
					free(pNewNs);
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				if (pCur->pNsURI == NULL) {
					pCur->pNsURI = pNewNs;
				} else {
					pPrevNs->nextNsURI = pNewNs;
				}
			} else {
				/* udpate the namespace */
				if (pNs->nsURI != NULL) {
					free(pNs->nsURI);
				}
				pNs->nsURI = safe_strdup(newNode->nodeValue);
				if (pNs->nsURI == NULL) {
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
			}
		}
	}
	if (xmlParser->pNeedPrefixNode != NULL) {
		ret = Parser_addNamespace(xmlParser);
		line = __LINE__;
		goto ExitFunction;
	}

ExitFunction:
	if (ret != IXML_SUCCESS && ret != IXML_FILE_DONE) {
		IxmlPrintf(__FILE__,
			line,
			"Parser_xmlNamespace",
			"Error %d\n",
			ret);
	}

	return ret;
}